

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void eddsa_openssh_blob(ssh_key *key,BinarySink *bs)

{
  ssh_key *psVar1;
  strbuf *buf_o;
  strbuf *buf_o_00;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen priv;
  strbuf *priv_sb;
  ptrlen pub;
  strbuf *pub_sb;
  eddsa_key *ek;
  BinarySink *bs_local;
  ssh_key *key_local;
  
  psVar1 = key + -3;
  if (*(int *)&psVar1->vt->new_pub == 2) {
    buf_o = strbuf_new();
    BinarySink_put_epoint
              (buf_o->binarysink_,(EdwardsPoint *)key[-2].vt,(ec_curve *)psVar1->vt,false);
    pl = make_ptrlen(buf_o->s + 4,buf_o->len - 4);
    buf_o_00 = strbuf_new_nm();
    BinarySink_put_mp_le_fixedlen
              (buf_o_00->binarysink_,(mp_int *)key[-1].vt,(size_t)psVar1->vt->invalid);
    pl_00 = make_ptrlen(buf_o_00->s + 4,buf_o_00->len - 4);
    BinarySink_put_stringpl(bs->binarysink_,pl);
    priv.ptr = (void *)pl_00.len;
    pub.ptr = (void *)pl.len;
    BinarySink_put_uint32(bs->binarysink_,(long)priv.ptr + (long)pub.ptr);
    BinarySink_put_datapl(bs->binarysink_,pl_00);
    BinarySink_put_datapl(bs->binarysink_,pl);
    strbuf_free(buf_o);
    strbuf_free(buf_o_00);
    return;
  }
  __assert_fail("ek->curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x37c,"void eddsa_openssh_blob(ssh_key *, BinarySink *)");
}

Assistant:

static void eddsa_openssh_blob(ssh_key *key, BinarySink *bs)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    assert(ek->curve->type == EC_EDWARDS);

    /* Encode the public and private points as strings */
    strbuf *pub_sb = strbuf_new();
    put_epoint(pub_sb, ek->publicKey, ek->curve, false);
    ptrlen pub = make_ptrlen(pub_sb->s + 4, pub_sb->len - 4);

    strbuf *priv_sb = strbuf_new_nm();
    put_mp_le_fixedlen(priv_sb, ek->privateKey, ek->curve->fieldBytes);
    ptrlen priv = make_ptrlen(priv_sb->s + 4, priv_sb->len - 4);

    put_stringpl(bs, pub);

    /* Encode the private key as the concatenation of the
     * little-endian key integer and the public key again */
    put_uint32(bs, priv.len + pub.len);
    put_datapl(bs, priv);
    put_datapl(bs, pub);

    strbuf_free(pub_sb);
    strbuf_free(priv_sb);
}